

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_jpege_base.c
# Opt level: O3

MPP_RET hal_jpege_vepu_rc(HalJpegeCtx *ctx,HalEncTask *task)

{
  int iVar1;
  long lVar2;
  short sVar3;
  int iVar4;
  RK_S32 RVar5;
  short sVar6;
  
  iVar1 = (task->rc_task->info).quality_target;
  if (iVar1 != (ctx->hal_rc).last_quality) {
    RVar5 = 100 - iVar1;
    (ctx->hal_rc).q_factor = RVar5;
    if (((byte)hal_jpege_debug & 0x10) != 0) {
      _mpp_log_l(4,"hal_jpege_base","use qfactor=%d, rc_info->quality_target=%d\n",(char *)0x0);
      RVar5 = (ctx->hal_rc).q_factor;
    }
    if (RVar5 < 0x32) {
      iVar1 = (int)(5000 / (long)RVar5);
    }
    else {
      iVar1 = RVar5 * -2 + 200;
    }
    lVar2 = 0;
    do {
      iVar4 = (uint)"\x10\v\n\x10\x18(3=\f\f\x0e\x13\x1a:<7\x0e\r\x10\x18(9E8\x0e\x11\x16\x1d3WP>\x12\x16%8DmgM\x18#7@Qhq\\1@NWgyxeH\\_bpdgc"
                    [lVar2] * iVar1 + 0x32;
      sVar3 = (short)(uint)((ulong)((long)iVar4 * 0x51eb851f) >> 0x25) - (short)(iVar4 >> 0x1f);
      if (0xfe < sVar3) {
        sVar3 = 0xff;
      }
      if (sVar3 < 2) {
        sVar3 = 1;
      }
      iVar4 = (uint)"\x11\x12\x18/cccc\x12\x15\x1aBcccc\x18\x1a8ccccc/Bcccccccccccccccccccccccccccccccccccccc"
                    [lVar2] * iVar1 + 0x32;
      sVar6 = (short)(uint)((ulong)((long)iVar4 * 0x51eb851f) >> 0x25) - (short)(iVar4 >> 0x1f);
      (ctx->hal_rc).qtable_y[lVar2] = (RK_U8)sVar3;
      if (0xfe < sVar6) {
        sVar6 = 0xff;
      }
      if (sVar6 < 2) {
        sVar6 = 1;
      }
      (ctx->hal_rc).qtable_c[lVar2] = (RK_U8)sVar6;
      lVar2 = lVar2 + 1;
    } while (lVar2 != 0x40);
  }
  return MPP_OK;
}

Assistant:

MPP_RET hal_jpege_vepu_rc(HalJpegeCtx *ctx, HalEncTask *task)
{
    HalJpegeRc *hal_rc = &ctx->hal_rc;
    EncRcTaskInfo *rc_info = (EncRcTaskInfo *)&task->rc_task->info;

    if (rc_info->quality_target != hal_rc->last_quality) {
        RK_U32 i = 0;
        RK_S32 q = 0;

        hal_rc->q_factor = 100 - rc_info->quality_target;
        hal_jpege_dbg_input("use qfactor=%d, rc_info->quality_target=%d\n", hal_rc->q_factor, rc_info->quality_target);

        q = hal_rc->q_factor;
        if (q < 50)
            q = 5000 / q;
        else
            q = 200 - (q << 1);

        for (i = 0; i < QUANTIZE_TABLE_SIZE; i++) {
            RK_S16 lq = (jpege_luma_quantizer[i] * q + 50) / 100;
            RK_S16 cq = (jpege_chroma_quantizer[i] * q + 50) / 100;

            /* Limit the quantizers to 1 <= q <= 255 */
            hal_rc->qtable_y[i] = MPP_CLIP3(1, 255, lq);
            hal_rc->qtable_c[i] = MPP_CLIP3(1, 255, cq);
        }
    }

    return MPP_OK;
}